

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O1

Ptr __thiscall
hwnet::TCPSocket::SetSendTimeoutCallback
          (TCPSocket *this,milliseconds timeout,SendTimeoutCallback *callback)

{
  function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *this_00;
  int iVar1;
  Timer *this_01;
  int iVar2;
  function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  bool bVar3;
  Ptr PVar4;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)(timeout + 0x938));
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  if ((*(byte *)(timeout + 0x928) & 1) == 0) {
    *(undefined8 *)(timeout + 0xad8) = 0;
    this_00 = (function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *)(timeout + 0xae0);
    if (*(code **)(timeout + 0xaf0) != (code *)0x0) {
      (**(code **)(timeout + 0xaf0))(this_00,this_00,3);
      *(undefined8 *)(timeout + 0xaf0) = 0;
      *(undefined8 *)(timeout + 0xaf8) = 0;
    }
    if ((callback == (SendTimeoutCallback *)0x0) ||
       ((in_RCX->super__Function_base)._M_manager == (_Manager_type)0x0)) {
      if (*(long *)(timeout + 0xaa8) == 0) {
        this_02 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(timeout + 0xaa0);
        if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          iVar2 = this_02->_M_use_count;
          do {
            if (iVar2 == 0) {
              this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              break;
            }
            LOCK();
            iVar1 = this_02->_M_use_count;
            bVar3 = iVar2 == iVar1;
            if (bVar3) {
              this_02->_M_use_count = iVar2 + 1;
              iVar1 = iVar2;
            }
            iVar2 = iVar1;
            UNLOCK();
          } while (!bVar3);
        }
        if (this_02 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          bVar3 = true;
        }
        else {
          bVar3 = this_02->_M_use_count == 0;
        }
        this_01 = ((__weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2> *)(timeout + 0xa98))
                  ->_M_ptr;
        if (!(bool)(this_01 == (Timer *)0x0 | bVar3)) {
          util::Timer::cancel(this_01);
          std::__weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::reset
                    ((__weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2> *)(timeout + 0xa98)
                    );
        }
        if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
        }
      }
    }
    else {
      *(SendTimeoutCallback **)(timeout + 0xad8) = callback;
      std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::operator=(this_00,in_RCX);
      registerTimer((TCPSocket *)timeout,1);
    }
  }
  std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<hwnet::TCPSocket,void>
            ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)this,
             (__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)(timeout + 0x18));
  pthread_mutex_unlock((pthread_mutex_t *)(timeout + 0x938));
  PVar4.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar4.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr)PVar4.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TCPSocket::Ptr TCPSocket::SetSendTimeoutCallback(util::milliseconds timeout, const SendTimeoutCallback &callback) {
	std::lock_guard<std::mutex> guard(this->mtx);
	if(!this->closed) {	
		this->sendTimeout = 0;
		this->sendTimeoutCallback_ = nullptr;

		if(timeout > 0 && callback) {
			this->sendTimeout = timeout;
			this->sendTimeoutCallback_ = callback;			
			this->registerTimer(timerSend);
		} else if(this->recvTimeout == 0) {
			if(auto sp = this->timer.lock()) {
				sp->cancel();
				this->timer.reset();
			}		
		}
	}

	return shared_from_this();
}